

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O2

void duckdb::PropagateCollations
               (ClientContext *param_1,ScalarFunction *bound_function,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *children)

{
  bool bVar1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *children_00;
  LogicalType *type;
  string collation;
  LogicalType collation_type;
  string local_70;
  string local_50;
  LogicalType local_30;
  
  type = &(bound_function->super_BaseScalarFunction).return_type;
  bVar1 = RequiresCollationPropagation(type);
  if (bVar1) {
    ExtractCollation_abi_cxx11_(&local_70,(duckdb *)children,children_00);
    if (local_70._M_string_length != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        local_50.field_2._8_8_ = local_70.field_2._8_8_;
      }
      else {
        local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
      }
      local_50._M_string_length = local_70._M_string_length;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      LogicalType::VARCHAR_COLLATION(&local_30,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      LogicalType::operator=(type,&local_30);
      LogicalType::~LogicalType(&local_30);
    }
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void PropagateCollations(ClientContext &, ScalarFunction &bound_function, vector<unique_ptr<Expression>> &children) {
	if (!RequiresCollationPropagation(bound_function.return_type)) {
		// we only need to propagate if the function returns a varchar
		return;
	}
	auto collation = ExtractCollation(children);
	if (collation.empty()) {
		// no collation to propagate
		return;
	}
	// propagate the collation to the return type
	auto collation_type = LogicalType::VARCHAR_COLLATION(std::move(collation));
	bound_function.return_type = std::move(collation_type);
}